

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int64_t simple_translation_pred_rd
                  (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,HandleInterModeArgs *args,
                  int ref_mv_idx,int64_t ref_best_rd,BLOCK_SIZE bsize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *skip_txfm_sb;
  int *out_rate_sum;
  AV1_COMP *cpi_00;
  MACROBLOCK *x_00;
  int64_t *in_RCX;
  RD_STATS *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  int64_t *in_R9;
  int64_t est_dist;
  int est_rate;
  int mi_col;
  int mi_row;
  int ref_mv_cost;
  int i;
  int_mv cur_mv [2];
  int drl_cost;
  int16_t mode_ctx;
  BUFFER_SET orig_dst;
  macroblockd_plane *p;
  ModeCosts *mode_costs;
  int is_comp_pred;
  AV1_COMMON *cm;
  int8_t ref_frame_type;
  MB_MODE_INFO_EXT *mbmi_ext;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  MV_REFERENCE_FRAME *in_stack_fffffffffffffef8;
  InterpFilter frame_interp_filter;
  MB_MODE_INFO *in_stack_ffffffffffffff00;
  ModeCosts *in_stack_ffffffffffffff08;
  MB_MODE_INFO_EXT *in_stack_ffffffffffffff10;
  MB_MODE_INFO *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  BLOCK_SIZE in_stack_ffffffffffffff37;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff44;
  PREDICTION_MODE this_mode;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  AV1_COMMON *in_stack_ffffffffffffff50;
  int plane_from;
  int plane_to;
  int plane_to_00;
  int in_stack_ffffffffffffff84;
  MACROBLOCKD *xd_00;
  BLOCK_SIZE bsize_00;
  MB_MODE_INFO *mbmi_00;
  undefined4 in_stack_ffffffffffffffd0;
  long local_8;
  
  this_mode = (PREDICTION_MODE)((uint)in_stack_ffffffffffffff44 >> 0x18);
  iVar3 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  skip_txfm_sb = (int *)(in_RSI + 0x1a0);
  mbmi_00 = (MB_MODE_INFO *)**(undefined8 **)(in_RSI + 0x2058);
  out_rate_sum = (int *)(in_RSI + 0x3c70);
  av1_ref_frame_type(in_stack_fffffffffffffef8);
  frame_interp_filter = (InterpFilter)((ulong)in_stack_fffffffffffffef8 >> 0x38);
  cpi_00 = (AV1_COMP *)(in_RDI + 0x3bf80);
  iVar1 = has_second_ref(mbmi_00);
  x_00 = (MACROBLOCK *)(in_RSI + 0x4230);
  xd_00 = (MACROBLOCKD *)(skip_txfm_sb + 4);
  plane_from = (int)*(undefined8 *)(skip_txfm_sb + 8);
  plane_to = (int)*(undefined8 *)(skip_txfm_sb + 0x294);
  plane_to_00 = skip_txfm_sb[0x526];
  av1_init_rd_stats(in_RDX);
  (mbmi_00->interinter_comp).type = '\0';
  *(ushort *)&mbmi_00->field_0xa7 = *(ushort *)&mbmi_00->field_0xa7 & 0xfeff;
  *(ushort *)&mbmi_00->field_0xa7 = *(ushort *)&mbmi_00->field_0xa7 & 0xfdff | 0x200;
  if (mbmi_00->ref_frame[1] == '\0') {
    mbmi_00->ref_frame[1] = -1;
  }
  av1_mode_context_analyzer
            ((int16_t *)in_stack_ffffffffffffff18,(MV_REFERENCE_FRAME *)in_stack_ffffffffffffff10);
  mbmi_00->num_proj_ref = '\0';
  mbmi_00->motion_mode = '\0';
  *(ushort *)&mbmi_00->field_0xa7 =
       *(ushort *)&mbmi_00->field_0xa7 & 0xffcf | ((byte)in_R8D & 3) << 4;
  in_RDX->rate = (int)in_RCX[0xe] + *(int *)((long)in_RCX + 0x74) + in_RDX->rate;
  iVar2 = get_drl_cost(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                       (int (*) [2])in_stack_ffffffffffffff08,
                       (int8_t)((ulong)in_stack_ffffffffffffff00 >> 0x38));
  in_RDX->rate = iVar2 + in_RDX->rate;
  iVar3 = build_cur_mv((int_mv *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       this_mode,
                       (AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       (MACROBLOCK *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                       iVar3);
  if (iVar3 == 0) {
    local_8 = 0x7fffffffffffffff;
  }
  else {
    for (iVar3 = 0; iVar3 < iVar1 + 1; iVar3 = iVar3 + 1) {
      mbmi_00->mv[iVar3] = *(int_mv *)(&stack0xffffffffffffff50 + (long)iVar3 * 4);
    }
    iVar2 = cost_mv_ref(in_stack_ffffffffffffff08,
                        (PREDICTION_MODE)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                        (int16_t)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    in_RDX->rate = iVar2 + in_RDX->rate;
    if ((long)in_R9 < (long)in_RDX->rate * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) {
      local_8 = 0x7fffffffffffffff;
    }
    else {
      mbmi_00->motion_mode = '\0';
      mbmi_00->num_proj_ref = '\0';
      if (iVar1 != 0) {
        (mbmi_00->interinter_comp).type = '\0';
        *(ushort *)&mbmi_00->field_0xa7 = *(ushort *)&mbmi_00->field_0xa7 & 0xfeff;
        *(ushort *)&mbmi_00->field_0xa7 = *(ushort *)&mbmi_00->field_0xa7 & 0xfdff | 0x200;
      }
      set_default_interp_filters(in_stack_ffffffffffffff00,frame_interp_filter);
      bsize_00 = (BLOCK_SIZE)((uint)iVar1 >> 0x18);
      av1_enc_build_inter_predictor
                (in_stack_ffffffffffffff50,(MACROBLOCKD *)CONCAT44(iVar3,iVar2),*skip_txfm_sb,
                 skip_txfm_sb[1],
                 (BUFFER_SET *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 in_stack_ffffffffffffff37,plane_from,plane_to);
      model_rd_for_sb_with_curvfit
                (cpi_00,bsize_00,x_00,xd_00,in_stack_ffffffffffffff84,plane_to_00,out_rate_sum,
                 (int64_t *)mbmi_00,(uint8_t *)skip_txfm_sb,in_R9,
                 (int *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),in_RCX,(int64_t *)in_RDX);
      local_8 = ((long)(in_RDX->rate + in_stack_ffffffffffffff3c) * (long)*(int *)(in_RSI + 0x4218)
                 + 0x100 >> 9) +
                CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30) * 0x80;
    }
  }
  return local_8;
}

Assistant:

static int64_t simple_translation_pred_rd(AV1_COMP *const cpi, MACROBLOCK *x,
                                          RD_STATS *rd_stats,
                                          HandleInterModeArgs *args,
                                          int ref_mv_idx, int64_t ref_best_rd,
                                          BLOCK_SIZE bsize) {
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const int8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
  const AV1_COMMON *cm = &cpi->common;
  const int is_comp_pred = has_second_ref(mbmi);
  const ModeCosts *mode_costs = &x->mode_costs;

  struct macroblockd_plane *p = xd->plane;
  const BUFFER_SET orig_dst = {
    { p[0].dst.buf, p[1].dst.buf, p[2].dst.buf },
    { p[0].dst.stride, p[1].dst.stride, p[2].dst.stride },
  };
  av1_init_rd_stats(rd_stats);

  mbmi->interinter_comp.type = COMPOUND_AVERAGE;
  mbmi->comp_group_idx = 0;
  mbmi->compound_idx = 1;
  if (mbmi->ref_frame[1] == INTRA_FRAME) {
    mbmi->ref_frame[1] = NONE_FRAME;
  }
  int16_t mode_ctx =
      av1_mode_context_analyzer(mbmi_ext->mode_context, mbmi->ref_frame);

  mbmi->num_proj_ref = 0;
  mbmi->motion_mode = SIMPLE_TRANSLATION;
  mbmi->ref_mv_idx = ref_mv_idx;

  rd_stats->rate += args->ref_frame_cost + args->single_comp_cost;
  const int drl_cost =
      get_drl_cost(mbmi, mbmi_ext, mode_costs->drl_mode_cost0, ref_frame_type);
  rd_stats->rate += drl_cost;

  int_mv cur_mv[2];
  if (!build_cur_mv(cur_mv, mbmi->mode, cm, x, 0)) {
    return INT64_MAX;
  }
  assert(have_nearmv_in_inter_mode(mbmi->mode));
  for (int i = 0; i < is_comp_pred + 1; ++i) {
    mbmi->mv[i].as_int = cur_mv[i].as_int;
  }
  const int ref_mv_cost = cost_mv_ref(mode_costs, mbmi->mode, mode_ctx);
  rd_stats->rate += ref_mv_cost;

  if (RDCOST(x->rdmult, rd_stats->rate, 0) > ref_best_rd) {
    return INT64_MAX;
  }

  mbmi->motion_mode = SIMPLE_TRANSLATION;
  mbmi->num_proj_ref = 0;
  if (is_comp_pred) {
    // Only compound_average
    mbmi->interinter_comp.type = COMPOUND_AVERAGE;
    mbmi->comp_group_idx = 0;
    mbmi->compound_idx = 1;
  }
  set_default_interp_filters(mbmi, cm->features.interp_filter);

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, &orig_dst, bsize,
                                AOM_PLANE_Y, AOM_PLANE_Y);
  int est_rate;
  int64_t est_dist;
  model_rd_sb_fn[MODELRD_CURVFIT](cpi, bsize, x, xd, 0, 0, &est_rate, &est_dist,
                                  NULL, NULL, NULL, NULL, NULL);
  return RDCOST(x->rdmult, rd_stats->rate + est_rate, est_dist);
}